

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BarrierTests.cpp
# Opt level: O0

void __thiscall barrier_basic_Test::TestBody(barrier_basic_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_178;
  Message local_170;
  int local_168;
  int local_164;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_1;
  duration<long,_std::ratio<1L,_1000L>_> local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  undefined1 local_130 [8];
  future<void> fut2;
  Message local_118;
  int local_110;
  int local_10c;
  undefined1 local_108 [8];
  AssertionResult gtest_ar;
  duration<long,_std::ratio<1L,_1000L>_> local_f0 [3];
  Barrier *local_d8;
  undefined1 *local_d0;
  undefined1 local_c8 [8];
  future<void> fut1;
  undefined1 local_b0 [4];
  atomic<int> count;
  Barrier barrier1;
  barrier_basic_Test *this_local;
  memory_order __b_1;
  memory_order __b;
  
  gmlc::concurrency::Barrier::Barrier((Barrier *)local_b0,2);
  fut1.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._4_4_ = 0;
  local_d0 = (undefined1 *)
             ((long)&fut1.super___basic_future<void>._M_state.
                     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 4);
  local_d8 = (Barrier *)local_b0;
  std::async<barrier_basic_Test::TestBody()::__0>((launch)local_c8,(type *)0x1);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 0x32;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)local_f0,
             (int *)((long)&gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 4));
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(local_f0);
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  local_10c = fut1.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi._4_4_;
  local_110 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_108,"count.load()","0",&local_10c,&local_110);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &fut2.super___basic_future<void>._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/BarrierTests.cpp"
               ,0x1f,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &fut2.super___basic_future<void>._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,&local_118);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &fut2.super___basic_future<void>._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  local_140 = local_b0;
  local_138 = (undefined1 *)
              ((long)&fut1.super___basic_future<void>._M_state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi + 4);
  std::async<barrier_basic_Test::TestBody()::__1>((launch)local_130,(type *)0x1);
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 0x32;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_148,
             (int *)((long)&gtest_ar_1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 4));
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_148);
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  local_164 = fut1.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi._4_4_;
  local_168 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_160,"count.load()","2",&local_164,&local_168);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/BarrierTests.cpp"
               ,0x25,pcVar2);
    testing::internal::AssertHelper::operator=(&local_178,&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  std::future<void>::get((future<void> *)local_130);
  std::future<void>::get((future<void> *)local_c8);
  std::future<void>::~future((future<void> *)local_130);
  std::future<void>::~future((future<void> *)local_c8);
  gmlc::concurrency::Barrier::~Barrier((Barrier *)local_b0);
  return;
}

Assistant:

TEST(barrier, basic)
{
    Barrier barrier1(2);
    std::atomic<int> count{0};
    auto fut1 = std::async(std::launch::async, [&barrier1, &count]() {
        barrier1.wait();
        ++count;
    });
    std::this_thread::sleep_for(std::chrono::milliseconds(50));
    EXPECT_EQ(count.load(), 0);
    auto fut2 = std::async(std::launch::async, [&barrier1, &count]() {
        barrier1.wait();
        ++count;
    });
    std::this_thread::sleep_for(std::chrono::milliseconds(50));
    EXPECT_EQ(count.load(), 2);
    fut2.get();
    fut1.get();
}